

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O1

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Block *pBVar5;
  PoolItem *pPVar6;
  Expression *pEVar7;
  long lVar8;
  
  pMVar1 = this->newModule;
  pBVar5 = getRemappedBlock(this,*(Block **)(__fn + 0x18));
  pPVar6 = PoolAllocator::allocateSpaceForObject(&pMVar1->allocator->pool,0x58);
  *(undefined8 *)&pPVar6->field_0x18 = 0;
  pPVar6[1].size = 0;
  pPVar6->item = &PTR__Branch_002d9ee0;
  pPVar6[1].destructor = (DestructorFn *)pBVar5;
  pPVar6[1].item = &pPVar6[2].destructor;
  *(undefined8 *)&pPVar6[1].field_0x18 = 0;
  pPVar6[2].size = 4;
  pPVar6->destructor =
       PoolAllocator::allocate<soul::heart::Branch,_soul::heart::Block_&>::anon_class_1_0_00000001::
       __invoke;
  lVar2 = *(long *)(__fn + 0x28);
  if (lVar2 != 0) {
    lVar3 = *(long *)(__fn + 0x20);
    lVar8 = 0;
    do {
      pEVar7 = cloneExpression(this,*(Expression **)(lVar3 + lVar8));
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                 &pPVar6[1].item,*(long *)&pPVar6[1].field_0x18 + 1);
      lVar4 = *(long *)&pPVar6[1].field_0x18;
      *(Expression **)((long)pPVar6[1].item + lVar4 * 8) = pEVar7;
      *(long *)&pPVar6[1].field_0x18 = lVar4 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar2 << 3 != lVar8);
  }
  return (int)pPVar6 + 0x10;
}

Assistant:

heart::Branch& clone (const heart::Branch& old)
    {
        auto& b = newModule.allocate<heart::Branch> (getRemappedBlock (old.target));

        for (auto& arg : old.targetArgs)
            b.targetArgs.push_back (cloneExpression (arg));

        return b;
    }